

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O1

ptr<resp_msg> __thiscall cornerstone::raft_server::handle_rm_srv_req(raft_server *this,req_msg *req)

{
  ulong uVar1;
  undefined4 uVar2;
  element_type *peVar3;
  buffer *pbVar4;
  pointer psVar5;
  long *plVar6;
  _func_int **pp_Var7;
  uint uVar8;
  undefined8 *puVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  runtime_error *prVar13;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  ulong uVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  long *plVar16;
  long *plVar17;
  pthread_rwlock_t *__rwlock;
  ptr<resp_msg> pVar18;
  undefined1 auVar19 [16];
  ptr<peer> p;
  ptr<req_msg> leave_req;
  undefined1 local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_e0 [2];
  pthread_rwlock_t *local_d0;
  ptr<req_msg> local_c8;
  element_type local_b8;
  char *local_60;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  
  peVar3 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->_vptr_raft_server = (_func_int **)0x0;
  puVar9 = (undefined8 *)operator_new(0x40);
  puVar9[1] = 0x100000001;
  *puVar9 = &PTR___Sp_counted_ptr_inplace_0017a728;
  puVar9[2] = &PTR__msg_base_00178628;
  puVar9[3] = peVar3;
  *(undefined4 *)(puVar9 + 4) = 9;
  uVar1 = (req->super_msg_base).term_;
  *(ulong *)((long)puVar9 + 0x24) = CONCAT44((int)uVar1,(int)(uVar1 >> 0x20));
  puVar9[2] = &PTR__msg_base_0017a778;
  puVar9[6] = 0;
  *(undefined1 *)(puVar9 + 7) = 0;
  *(undefined8 **)&this->leader_ = puVar9;
  this->_vptr_raft_server = (_func_int **)(puVar9 + 2);
  if (*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38) == 0x10) {
    pbVar4 = *(buffer **)(**(long **)(in_RDX + 0x38) + 0x18);
    if (pbVar4 == (buffer *)0x0) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar13,"get_buf cannot be called for a log_entry with nil buffer");
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar10 = buffer::size(pbVar4);
    if (sVar10 != 4) goto LAB_0014ecca;
    if (*(int *)&req[3].log_entries_.
                 super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 3) {
      if (*(char *)((long)&req->last_log_idx_ + 1) == '\x01') {
        plVar16 = (long *)req[4].last_log_term_;
        local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &local_b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"previous config has not committed yet","");
        (**(code **)(*plVar16 + 0x18))(plVar16,&local_c8);
        _Var14._M_pi = extraout_RDX;
      }
      else {
        pbVar4 = *(buffer **)(**(long **)(in_RDX + 0x38) + 0x18);
        if (pbVar4 == (buffer *)0x0) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar13,"get_buf cannot be called for a log_entry with nil buffer");
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar8 = buffer::get_int(pbVar4);
        if (uVar8 != *(uint *)((long)&(req->super_msg_base).term_ + 4)) {
          _local_e8 = (undefined1  [16])0x0;
          __rwlock = (pthread_rwlock_t *)&req[2].super_msg_base.dst_;
          std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
          psVar5 = req[1].log_entries_.
                   super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar15 = (ulong)(long)(int)uVar8 % (ulong)psVar5;
          plVar16 = *(long **)(req[1].commit_idx_ + uVar15 * 8);
          plVar17 = (long *)0x0;
          if ((plVar16 != (long *)0x0) &&
             (plVar6 = (long *)*plVar16, plVar17 = plVar16, uVar8 != *(uint *)((long *)*plVar16 + 1)
             )) {
            while (plVar16 = plVar6, plVar6 = (long *)*plVar16, plVar6 != (long *)0x0) {
              plVar17 = (long *)0x0;
              if (((ulong)(long)(int)*(uint *)(plVar6 + 1) % (ulong)psVar5 != uVar15) ||
                 (plVar17 = plVar16, uVar8 == *(uint *)(plVar6 + 1))) goto LAB_0014ee37;
            }
            plVar17 = (long *)0x0;
          }
LAB_0014ee37:
          if (plVar17 == (long *)0x0) {
            lVar12 = 0;
          }
          else {
            lVar12 = *plVar17;
          }
          if (lVar12 == 0) {
            local_38 = (long *)req[4].last_log_term_;
            local_60 = "server %d does not exist";
            local_d0 = __rwlock;
            snprintf((char *)&local_c8,100,"server %d does not exist",(ulong)uVar8);
            local_58[0] = local_48;
            sVar11 = strlen((char *)&local_c8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_58,&local_c8,
                       (long)&local_c8.
                              super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + sVar11);
            (**(code **)(*local_38 + 0x18))(local_38,local_58);
            __rwlock = local_d0;
            if (local_58[0] != local_48) {
              operator_delete(local_58[0],local_48[0] + 1);
            }
          }
          else {
            a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_e8 = (undefined1  [8])*(ulong *)(lVar12 + 0x10);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar12 + 0x18));
          }
          pthread_rwlock_unlock(__rwlock);
          _Var14._M_pi = extraout_RDX_04;
          if (lVar12 != 0) {
            peVar3 = ((req[3].log_entries_.
                       super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->
                     super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            lVar12 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
            local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
            (local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count = 1;
            (local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_weak_count = 1;
            (local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_vptr__Sp_counted_base =
                 (_func_int **)&PTR___Sp_counted_ptr_inplace_00178590;
            local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 (local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 1);
            uVar2 = *(undefined4 *)((long)&(req->super_msg_base).term_ + 4);
            pp_Var7 = *(_func_int ***)&(req->super_msg_base).dst_;
            *(element_type **)
             &local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[1]._M_use_count = peVar3;
            *(undefined4 *)
             &local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[2]._vptr__Sp_counted_base = 0xe;
            *(undefined4 *)
             ((long)&local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi[2]._vptr__Sp_counted_base + 4) = uVar2;
            local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[2]._M_use_count = uVar8;
            local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__req_msg_001785e0;
            local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
            *(long *)&local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi[3]._M_use_count = lVar12 + -1;
            local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[4]._vptr__Sp_counted_base = pp_Var7;
            *(undefined1 (*) [16])
             &local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[4]._M_use_count = (undefined1  [16])0x0;
            local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[5]._M_use_count = 0;
            local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[5]._M_weak_count = 0;
            peer::send_req((peer *)local_e8,&local_c8,(rpc_handler *)&req[9].super_msg_base.type_);
            pp_Var7 = this->_vptr_raft_server;
            auVar19 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
            _Var14._M_pi = auVar19._8_8_;
            pp_Var7[4] = auVar19._0_8_;
            *(undefined1 *)(pp_Var7 + 5) = 1;
            if (local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c8.
                         super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              _Var14._M_pi = extraout_RDX_05;
            }
          }
          if (a_Stack_e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_e0[0]._M_pi);
            _Var14._M_pi = extraout_RDX_06;
          }
          goto LAB_0014ed17;
        }
        plVar16 = (long *)req[4].last_log_term_;
        local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &local_b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"cannot request to remove leader","");
        (**(code **)(*plVar16 + 0x18))(plVar16,&local_c8);
        _Var14._M_pi = extraout_RDX_03;
      }
    }
    else {
      plVar16 = (long *)req[4].last_log_term_;
      local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"this is not a leader, cannot handle RemoveServerRequest","");
      (**(code **)(*plVar16 + 0x18))(plVar16,&local_c8);
      _Var14._M_pi = extraout_RDX_02;
    }
  }
  else {
LAB_0014ecca:
    plVar16 = (long *)req[4].last_log_term_;
    local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_b8
    ;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,
               "bad remove server request as we are expecting one log entry with value type of int",
               "");
    (**(code **)(*plVar16 + 0x18))(plVar16,&local_c8);
    _Var14._M_pi = extraout_RDX_00;
  }
  if (local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      &local_b8) {
    operator_delete(local_c8.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_b8.super_msg_base._vptr_msg_base + 1);
    _Var14._M_pi = extraout_RDX_01;
  }
LAB_0014ed17:
  pVar18.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var14._M_pi;
  pVar18.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar18.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_rm_srv_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries(req.log_entries());
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::remove_server_response, id_, leader_));
    if (entries.size() != 1 || entries[0]->get_buf().size() != sz_int)
    {
        l_->info("bad remove server request as we are expecting one log entry with value type of int");
        return resp;
    }

    if (role_ != srv_role::leader)
    {
        l_->info("this is not a leader, cannot handle RemoveServerRequest");
        return resp;
    }

    if (config_changing_)
    {
        // the previous config has not committed yet
        l_->info("previous config has not committed yet");
        return resp;
    }

    int32 srv_id = entries[0]->get_buf().get_int();
    if (srv_id == id_)
    {
        l_->info("cannot request to remove leader");
        return resp;
    }

    ptr<peer> p;
    {
        read_lock(peers_lock_);
        peer_itor pit = peers_.find(srv_id);
        if (pit == peers_.end())
        {
            l_->info(sstrfmt("server %d does not exist").fmt(srv_id));
            return resp;
        }

        p = pit->second;
    }

    ptr<req_msg> leave_req(cs_new<req_msg>(
        state_->get_term(),
        msg_type::leave_cluster_request,
        id_,
        srv_id,
        0,
        log_store_->next_slot() - 1,
        quick_commit_idx_));
    p->send_req(leave_req, ex_resp_handler_);
    resp->accept(log_store_->next_slot());
    return resp;
}